

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdCelsiusSurfUnk2b8::is_valid_val(MthdCelsiusSurfUnk2b8 *this)

{
  MthdCelsiusSurfUnk2b8 *this_local;
  
  if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x24 == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.val & 3) < 3) {
      if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3e < 3) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 4, 28))
			return false;
		if (extr(val, 0, 2) > 2)
			return false;
		if (extr(val, 2, 2) > 2)
			return false;
		return true;
	}